

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::GetPropertyBuiltIns(JavascriptArray *this,PropertyId propertyId,Var *value)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  double value_00;
  
  BVar4 = 0;
  if (propertyId == 0xd1) {
    uVar1 = (this->super_ArrayObject).length;
    if ((long)(int)uVar1 < 0) {
      value_00 = (double)uVar1;
      uVar5 = NumberUtilities::ToSpecial(value_00);
      bVar3 = NumberUtilities::IsNan(value_00);
      if (bVar3) {
        uVar6 = NumberUtilities::ToSpecial(value_00);
        if (uVar6 != 0xfff8000000000000) {
          uVar6 = NumberUtilities::ToSpecial(value_00);
          if (uVar6 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar7 = 0;
          }
        }
      }
      pvVar8 = (Var)(uVar5 ^ 0xfffc000000000000);
    }
    else {
      pvVar8 = (Var)((long)(int)uVar1 | 0x1000000000000);
    }
    *value = pvVar8;
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL JavascriptArray::GetPropertyBuiltIns(PropertyId propertyId, Var* value)
    {
        //
        // length being accessed. Return array length
        //
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), GetScriptContext());
            return true;
        }

        return false;
    }